

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Type_vector(int count,int blocklength,int stride,MPIABI_Datatype oldtype,
                      MPIABI_Datatype *newtype)

{
  int iVar1;
  
  iVar1 = MPI_Type_vector();
  return iVar1;
}

Assistant:

int MPIABI_Type_vector(
  int count,
  int blocklength,
  int stride,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_vector(
    count,
    blocklength,
    stride,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}